

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statements.cpp
# Opt level: O3

void __thiscall
slang::ast::ConditionalStatement::serializeTo(ConditionalStatement *this,ASTSerializer *serializer)

{
  size_type sVar1;
  Expression *__n;
  pointer pCVar2;
  pointer pCVar3;
  string_view name;
  
  name._M_str = "conditions";
  name._M_len = 10;
  ASTSerializer::startArray(serializer,name);
  sVar1 = (this->conditions).size_;
  if (sVar1 != 0) {
    pCVar2 = (this->conditions).data_;
    pCVar3 = pCVar2 + sVar1;
    do {
      ASTSerializer::startObject(serializer);
      __n = (pCVar2->expr).ptr;
      if (__n == (Expression *)0x0) {
        assert::assertFailed
                  ("ptr",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
                   ,0x26,
                   "T slang::not_null<const slang::ast::Expression *>::get() const [T = const slang::ast::Expression *]"
                  );
      }
      ASTSerializer::write(serializer,4,"expr",(size_t)__n);
      if (pCVar2->pattern != (Pattern *)0x0) {
        ASTSerializer::write(serializer,7,"pattern",(size_t)pCVar2->pattern);
      }
      ASTSerializer::endObject(serializer);
      pCVar2 = pCVar2 + 1;
    } while (pCVar2 != pCVar3);
  }
  ASTSerializer::endArray(serializer);
  ASTSerializer::write(serializer,6,"ifTrue",(size_t)this->ifTrue);
  if (this->ifFalse != (Statement *)0x0) {
    ASTSerializer::write(serializer,7,"ifFalse",(size_t)this->ifFalse);
    return;
  }
  return;
}

Assistant:

void ConditionalStatement::serializeTo(ASTSerializer& serializer) const {
    serializer.startArray("conditions");
    for (auto& cond : conditions) {
        serializer.startObject();
        serializer.write("expr", *cond.expr);
        if (cond.pattern)
            serializer.write("pattern", *cond.pattern);
        serializer.endObject();
    }
    serializer.endArray();

    serializer.write("ifTrue", ifTrue);
    if (ifFalse)
        serializer.write("ifFalse", *ifFalse);
}